

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O2

int Saig_XsimInv(int Value)

{
  if (Value - 1U < 3) {
    return *(int *)(&DAT_007a78ac + (ulong)(Value - 1U) * 4);
  }
  __assert_fail("Value == SAIG_XVSX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                ,0x32,"int Saig_XsimInv(int)");
}

Assistant:

static inline int  Saig_XsimInv( int Value )   
{ 
    if ( Value == SAIG_XVS0 )
        return SAIG_XVS1;
    if ( Value == SAIG_XVS1 )
        return SAIG_XVS0;
    assert( Value == SAIG_XVSX );       
    return SAIG_XVSX;
}